

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

result_type __thiscall
Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
::operator()(Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
             *this)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  sVar2 = this->index_;
  uVar1 = sVar2 + 0x56e;
  if (uVar1 < 0xade) {
    uVar3 = sVar2 - 1;
    if (uVar1 < 0x56f) {
      uVar3 = uVar1;
    }
    uVar1 = sVar2 + 0x56d;
    if (uVar1 < 0xade) {
      uVar6 = sVar2 - 2;
      if (uVar1 < 0x56f) {
        uVar6 = uVar1;
      }
      uVar1 = sVar2 + 0x17;
      if (uVar1 < 0xade) {
        uVar11 = sVar2 + 0x1e1;
        uVar9 = sVar2 - 0x558;
        if (uVar1 < 0x56f) {
          uVar9 = uVar1;
        }
        if ((uVar11 < 0xade) && (uVar1 = sVar2 + 0xe5, uVar1 < 0xade)) {
          uVar10 = sVar2 - 0x38e;
          if (uVar11 < 0x56f) {
            uVar10 = uVar11;
          }
          uVar4 = (this->state_[uVar9] >> 0x1e | this->state_[sVar2] << 0x18) ^
                  this->state_[sVar2] ^ this->state_[uVar9];
          uVar11 = sVar2 - 0x48a;
          if (uVar1 < 0x56f) {
            uVar11 = uVar1;
          }
          uVar8 = this->state_[uVar11] << 0x1a ^ this->state_[uVar10] << 10 ^ this->state_[uVar10];
          uVar7 = (uVar8 & 0x7dffff) << 9 | uVar8 >> 0x17;
          uVar5 = uVar7 ^ 0xb729fcec;
          if ((uVar8 >> 0x11 & 1) == 0) {
            uVar5 = uVar7;
          }
          uVar5 = uVar4 >> 0x14 ^ (this->state_[uVar6] & 0x7fff | this->state_[uVar3] & 0xffff8000)
                  ^ uVar8 ^ uVar5;
          this->state_[sVar2] = uVar8 ^ uVar4;
          this->state_[uVar3] = uVar5;
          this->index_ = uVar3;
          uVar5 = (uVar5 & 0x127ba28) << 7 ^ uVar5;
          return (uVar5 & 0x1f423) << 0xf ^ uVar5;
        }
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 1391>::calc(T, std::false_type) [UIntType = unsigned long, r = 1391, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }